

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O1

ReturnType_conflict
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<move_only,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::_impl::
success_or<ezy::strong_type<std::variant<move_only,std::__cxx11::string>,void,ezy::features::result_like_continuation>,move_only>
          (strong_type<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
           *t,move_only *alternative)

{
  if (*(__index_type *)
       ((long)&(t->
               super_strong_type_base<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<move_only,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<move_only,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<move_only,_std::__cxx11::basic_string<char>_> + 0x20) == '\0')
  {
    alternative = std::get<0ul,move_only,std::__cxx11::string>
                            ((variant<move_only,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)t);
  }
  return (ReturnType_conflict)alternative->i;
}

Assistant:

static constexpr decltype(auto) success_or(ST&& t, Alternative&& alternative)
        {
          using dST = ezy::remove_cvref_t<ST>;
          using trait = Adapter<typename dST::type>;

          using ReturnType = typename trait::success_type;
          if (trait::is_success(std::forward<ST>(t).get()))
            return ReturnType{trait::get_success(std::forward<ST>(t).get())};
          else
            return ReturnType{std::forward<Alternative>(alternative)};
        }